

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O2

void __thiscall cell_map::set_cell(cell_map *this,int x,int y)

{
  int iVar1;
  pointer puVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar1 = this->width;
  iVar4 = iVar1 * y;
  puVar2 = (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((puVar2[iVar4 + x] & 1) == 0) {
    uVar5 = -(uint)(x != 0) | iVar1 - 1U;
    iVar8 = this->height + -1;
    iVar7 = iVar8 * iVar1;
    iVar9 = -iVar1;
    if (y == 0) {
      iVar9 = iVar7;
    }
    iVar6 = 1 - iVar1;
    if (iVar1 - 1U != x) {
      iVar6 = 1;
    }
    iVar7 = -iVar7;
    if (iVar8 != y) {
      iVar7 = iVar1;
    }
    puVar2[(long)x + (long)iVar4] = puVar2[(long)x + (long)iVar4] | 1;
    lVar3 = (long)x + (long)iVar4;
    puVar2[(int)(iVar9 + uVar5) + lVar3] = puVar2[(int)(iVar9 + uVar5) + lVar3] + '\x02';
    puVar2[iVar9 + lVar3] = puVar2[iVar9 + lVar3] + '\x02';
    puVar2[(iVar9 + iVar6) + lVar3] = puVar2[(iVar9 + iVar6) + lVar3] + '\x02';
    puVar2[(int)uVar5 + lVar3] = puVar2[(int)uVar5 + lVar3] + '\x02';
    puVar2[iVar6 + lVar3] = puVar2[iVar6 + lVar3] + '\x02';
    puVar2[(int)(uVar5 + iVar7) + lVar3] = puVar2[(int)(uVar5 + iVar7) + lVar3] + '\x02';
    puVar2[iVar7 + lVar3] = puVar2[iVar7 + lVar3] + '\x02';
    puVar2[(iVar7 + iVar6) + lVar3] = puVar2[(iVar7 + iVar6) + lVar3] + '\x02';
    return;
  }
  __assert_fail("cell_state(x, y) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/life/life.h"
                ,0x1a,"void cell_map::set_cell(int, int)");
}

Assistant:

void set_cell(int x, int y)
    {
    assert(cell_state(x, y) == 0);

    auto cell_ptr = cells.begin() + (y*width) + x;
    int xoleft, xoright, yoabove, yobelow;

    if (x == 0)
      xoleft = width - 1;
    else
      xoleft = -1;
    if (y == 0)
      yoabove = width * (height - 1);
    else
      yoabove = -width;
    if (x == (width - 1))
      xoright = -(width - 1);
    else
      xoright = 1;
    if (y == (height - 1))
      yobelow = -width * (height - 1);
    else
      yobelow = width;

    *(cell_ptr) |= (uint8_t)0x01;
    *(cell_ptr + (yoabove + xoleft)) += 2;
    *(cell_ptr + yoabove) += 2;
    *(cell_ptr + (yoabove + xoright)) += 2;
    *(cell_ptr + xoleft) += 2;
    *(cell_ptr + xoright) += 2;
    *(cell_ptr + (yobelow + xoleft)) += 2;
    *(cell_ptr + yobelow) += 2;
    *(cell_ptr + (yobelow + xoright)) += 2;
    }